

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void Am_Stop_Interactor(Am_Object *inter,Am_Object *stop_obj,Am_Input_Char stop_char,
                       Am_Object *stop_window,int stop_x,int stop_y,bool update_now)

{
  bool bVar1;
  Am_Inter_State AVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  undefined1 local_90 [8];
  Am_Inter_Internal_Method method;
  Am_Input_Event ev;
  Am_Object local_40;
  Am_Inter_State local_38;
  byte local_31;
  Am_Inter_State state;
  int iStack_2c;
  bool update_now_local;
  int stop_y_local;
  int stop_x_local;
  Am_Object *stop_window_local;
  Am_Object *stop_obj_local;
  Am_Object *inter_local;
  Am_Input_Char stop_char_local;
  
  local_31 = update_now;
  state = stop_y;
  iStack_2c = stop_x;
  _stop_y_local = stop_window;
  stop_window_local = stop_obj;
  stop_obj_local = inter;
  inter_local._4_4_ = stop_char;
  Am_Object::Am_Object(&local_40,inter);
  AVar2 = Am_Get_Inter_State(&local_40);
  Am_Object::~Am_Object(&local_40);
  if (AVar2 != Am_INTER_WAITING) {
    local_38 = AVar2;
    bVar1 = Am_Object::Valid(stop_obj);
    if (bVar1) {
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(stop_obj);
      Am_Object::Set(inter,0x119,pAVar4,0);
    }
    else {
      pAVar3 = Am_Object::Get(inter,0x119,0);
      Am_Object::operator=(stop_obj,pAVar3);
    }
    bVar1 = Am_Object::Valid(stop_obj);
    if ((bVar1) && (bVar1 = Am_Object::Valid(stop_window), !bVar1)) {
      pAVar3 = Am_Object::Get(stop_obj,0x68,0);
      Am_Object::operator=(stop_window,pAVar3);
      bVar1 = Am_Object::Valid(stop_window);
      if ((!bVar1) ||
         (bVar1 = Am_Translate_Coordinates
                            (stop_obj,0,0,stop_window,&stack0xffffffffffffffd4,(int *)&state),
         !bVar1)) {
        pAVar3 = Am_Object::Get(stop_obj,100,0);
        iStack_2c = Am_Value::operator_cast_to_int(pAVar3);
        pAVar3 = Am_Object::Get(stop_obj,0x65,0);
        state = Am_Value::operator_cast_to_int(pAVar3);
      }
    }
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(stop_window);
    Am_Object::Set(inter,0x68,pAVar4,0);
    Am_Input_Event::Am_Input_Event((Am_Input_Event *)&method.Call);
    Am_Input_Char::operator=
              ((Am_Input_Char *)&method.Call,(Am_Input_Char *)((long)&inter_local + 4));
    Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)local_90);
    pAVar3 = Am_Object::Get(inter,0xc2,0);
    Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)local_90,pAVar3);
    (*(code *)method.from_wrapper)(inter,stop_obj,stop_window,&method.Call);
    if ((local_31 & 1) != 0) {
      do_update();
    }
    Am_Input_Event::~Am_Input_Event((Am_Input_Event *)&method.Call);
  }
  return;
}

Assistant:

void
Am_Stop_Interactor(Am_Object inter, Am_Object stop_obj, Am_Input_Char stop_char,
                   Am_Object stop_window, int stop_x, int stop_y,
                   bool update_now)
{

  Am_Inter_State state = Am_Get_Inter_State(inter);

  if (state == Am_INTER_WAITING) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Explicitly stopping Interactor "
                                                   << inter
                                                   << " but it is not running");
    return;
  }

  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Explicitly Stopping " << inter);
  if (!stop_obj.Valid())
    stop_obj = inter.Get(Am_CURRENT_OBJECT);
  else
    inter.Set(Am_CURRENT_OBJECT, stop_obj);
  if (stop_obj.Valid()) {
    if (!stop_window.Valid()) {
      stop_window = stop_obj.Get(Am_WINDOW);
      if (stop_window.Valid() &&
          Am_Translate_Coordinates(stop_obj, 0, 0, stop_window, stop_x, stop_y))
        //then have pos of start_obj in start_window
        ;
      else {
        stop_x = stop_obj.Get(Am_LEFT);
        stop_y = stop_obj.Get(Am_TOP);
      }
    }
  }
  //now stop the interactor
  inter.Set(Am_WINDOW, stop_window);
  Am_Input_Event ev;
  ev.input_char = stop_char;
  ev.x = stop_x;
  ev.y = stop_y;
  ev.draw = nullptr;
  ev.time_stamp = 0;
  Am_Inter_Internal_Method method;
  method = inter.Get(Am_INTER_STOP_METHOD);
  method.Call(inter, stop_obj, stop_window, &ev);
  if (update_now)
    do_update();
}